

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.h
# Opt level: O0

int32_t bcf_dec_int1(uint8_t *p,int type,uint8_t **q)

{
  uint8_t **q_local;
  int type_local;
  uint8_t *p_local;
  
  if (type == 1) {
    *q = p + 1;
    p_local._4_4_ = (int)(char)*p;
  }
  else if (type == 2) {
    *q = p + 2;
    p_local._4_4_ = (int)*(short *)p;
  }
  else {
    *q = p + 4;
    p_local._4_4_ = *(int *)p;
  }
  return p_local._4_4_;
}

Assistant:

static inline int32_t bcf_dec_int1(const uint8_t *p, int type, uint8_t **q)
{
    if (type == BCF_BT_INT8) {
        *q = (uint8_t*)p + 1;
        return *(int8_t*)p;
    } else if (type == BCF_BT_INT16) {
        *q = (uint8_t*)p + 2;
        return *(int16_t*)p;
    } else {
        *q = (uint8_t*)p + 4;
        return *(int32_t*)p;
    }
}